

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O0

int UpnpSetMaxSubscriptions(UpnpDevice_Handle Hnd,int MaxSubscriptions)

{
  Upnp_Handle_Type UVar1;
  Handle_Info *local_20;
  Handle_Info *SInfo;
  UpnpDevice_Handle local_10;
  int MaxSubscriptions_local;
  UpnpDevice_Handle Hnd_local;
  
  local_20 = (Handle_Info *)0x0;
  if (UpnpSdkInit == 1) {
    SInfo._4_4_ = MaxSubscriptions;
    local_10 = Hnd;
    UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x845,"Inside UpnpSetMaxSubscriptions \n");
    HandleLock(".upnp/src/api/upnpapi.c",0x848);
    UVar1 = GetHandleInfo(local_10,&local_20);
    if (UVar1 == HND_DEVICE) {
      if ((SInfo._4_4_ == -1) || (-1 < SInfo._4_4_)) {
        local_20->MaxSubscriptions = SInfo._4_4_;
        HandleUnlock(".upnp/src/api/upnpapi.c",0x855);
        UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x85a,"Exiting UpnpSetMaxSubscriptions \n"
                  );
        MaxSubscriptions_local = 0;
      }
      else {
        HandleUnlock(".upnp/src/api/upnpapi.c",0x851);
        MaxSubscriptions_local = -100;
      }
    }
    else {
      HandleUnlock(".upnp/src/api/upnpapi.c",0x84d);
      MaxSubscriptions_local = -100;
    }
  }
  else {
    MaxSubscriptions_local = -0x74;
  }
  return MaxSubscriptions_local;
}

Assistant:

int UpnpSetMaxSubscriptions(UpnpDevice_Handle Hnd, int MaxSubscriptions)
{
	struct Handle_Info *SInfo = NULL;

	if (UpnpSdkInit != 1) {
		return UPNP_E_FINISH;
	}

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Inside UpnpSetMaxSubscriptions \n");

	HandleLock(__FILE__, __LINE__);
	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_DEVICE:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_HANDLE;
	}
	if ((MaxSubscriptions != UPNP_INFINITE) && (MaxSubscriptions < 0)) {
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_HANDLE;
	}
	SInfo->MaxSubscriptions = MaxSubscriptions;
	HandleUnlock(__FILE__, __LINE__);

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Exiting UpnpSetMaxSubscriptions \n");

	return UPNP_E_SUCCESS;
}